

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

bool bsim::signed_gt(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  bool bVar1;
  quad_value qVar2;
  quad_value qVar3;
  int iVar4;
  int iVar5;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  int N;
  uint6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 uVar6;
  uchar in_stack_ffffffffffffffcf;
  uchar v;
  quad_value in_stack_ffffffffffffffd4;
  quad_value in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_1;
  
  bVar1 = quad_value_bit_vector::is_binary
                    ((quad_value_bit_vector *)
                     CONCAT17(in_stack_ffffffffffffffdf,
                              CONCAT16(in_stack_ffffffffffffffde,
                                       CONCAT15(in_stack_ffffffffffffffdd,
                                                CONCAT14(in_stack_ffffffffffffffdc,
                                                         in_stack_ffffffffffffffd8)))));
  if ((bVar1) &&
     (bVar1 = quad_value_bit_vector::is_binary
                        ((quad_value_bit_vector *)
                         CONCAT17(in_stack_ffffffffffffffdf,
                                  CONCAT16(in_stack_ffffffffffffffde,
                                           CONCAT15(in_stack_ffffffffffffffdd,
                                                    CONCAT14(in_stack_ffffffffffffffdc,
                                                             in_stack_ffffffffffffffd8))))), bVar1))
  {
    iVar4 = quad_value_bit_vector::bitLength(in_RDI);
    iVar5 = quad_value_bit_vector::bitLength(in_RSI);
    if (iVar4 != iVar5) {
      __assert_fail("a.bitLength() == b.bitLength()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x388,
                    "bool bsim::signed_gt(const quad_value_bit_vector &, const quad_value_bit_vector &)"
                   );
    }
    iVar5 = quad_value_bit_vector::bitLength(in_RDI);
    quad_value_bit_vector::get
              ((quad_value_bit_vector *)
               CONCAT17(in_stack_ffffffffffffffcf,
                        CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),0);
    quad_value::quad_value
              ((quad_value *)
               CONCAT17(in_stack_ffffffffffffffd7,
                        CONCAT16(in_stack_ffffffffffffffd6,
                                 CONCAT15(in_stack_ffffffffffffffd5.value,
                                          CONCAT14(in_stack_ffffffffffffffd4.value,iVar4)))),
               in_stack_ffffffffffffffcf);
    bVar1 = operator==((quad_value *)
                       CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,
                                         CONCAT15(in_stack_ffffffffffffffd5.value,
                                                  CONCAT14(in_stack_ffffffffffffffd4.value,iVar4))))
                       ,(quad_value *)
                        CONCAT17(in_stack_ffffffffffffffcf,
                                 CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
    v = false;
    if (bVar1) {
      quad_value_bit_vector::get
                ((quad_value_bit_vector *)
                 (ulong)CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),0);
      quad_value::quad_value
                ((quad_value *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,
                                   CONCAT15(in_stack_ffffffffffffffd5.value,
                                            CONCAT14(in_stack_ffffffffffffffd4.value,iVar4)))),v);
      v = operator==((quad_value *)
                     CONCAT17(in_stack_ffffffffffffffd7,
                              CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT15(in_stack_ffffffffffffffd5.value,
                                                CONCAT14(in_stack_ffffffffffffffd4.value,iVar4)))),
                     (quad_value *)
                     CONCAT17(v,CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
    }
    if ((bool)v == false) {
      quad_value_bit_vector::get
                ((quad_value_bit_vector *)
                 (ulong)CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),0);
      quad_value::quad_value
                ((quad_value *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,
                                   CONCAT15(in_stack_ffffffffffffffd5.value,
                                            CONCAT14(in_stack_ffffffffffffffd4.value,iVar4)))),v);
      bVar1 = operator==((quad_value *)
                         CONCAT17(in_stack_ffffffffffffffd7,
                                  CONCAT16(in_stack_ffffffffffffffd6,
                                           CONCAT15(in_stack_ffffffffffffffd5.value,
                                                    CONCAT14(in_stack_ffffffffffffffd4.value,iVar4))
                                          )),
                         (quad_value *)
                         CONCAT17(v,CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
      uVar6 = false;
      if (bVar1) {
        quad_value_bit_vector::get
                  ((quad_value_bit_vector *)CONCAT17(v,(uint7)in_stack_ffffffffffffffc8),0);
        quad_value::quad_value
                  ((quad_value *)
                   CONCAT17(in_stack_ffffffffffffffd7,
                            CONCAT16(in_stack_ffffffffffffffd6,
                                     CONCAT15(in_stack_ffffffffffffffd5.value,
                                              CONCAT14(in_stack_ffffffffffffffd4.value,iVar4)))),v);
        uVar6 = operator==((quad_value *)
                           CONCAT17(in_stack_ffffffffffffffd7,
                                    CONCAT16(in_stack_ffffffffffffffd6,
                                             CONCAT15(in_stack_ffffffffffffffd5.value,
                                                      CONCAT14(in_stack_ffffffffffffffd4.value,iVar4
                                                              )))),
                           (quad_value *)CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)));
      }
      if ((bool)uVar6 == false) {
        uVar6 = 0;
        for (iVar5 = iVar5 + -2; -1 < iVar5; iVar5 = iVar5 + -1) {
          qVar2 = quad_value_bit_vector::get
                            ((quad_value_bit_vector *)
                             CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)),0);
          qVar3 = quad_value_bit_vector::get
                            ((quad_value_bit_vector *)
                             CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)),0);
          bVar1 = operator>((quad_value *)
                            CONCAT17(qVar2.value,
                                     CONCAT16(qVar3.value,
                                              CONCAT15(in_stack_ffffffffffffffd5.value,
                                                       CONCAT14(in_stack_ffffffffffffffd4.value,
                                                                iVar4)))),
                            (quad_value *)CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)));
          if (bVar1) {
            return true;
          }
          in_stack_ffffffffffffffd5 =
               quad_value_bit_vector::get
                         ((quad_value_bit_vector *)
                          CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)),0);
          in_stack_ffffffffffffffd4 =
               quad_value_bit_vector::get
                         ((quad_value_bit_vector *)
                          CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)),0);
          bVar1 = operator<((quad_value *)
                            CONCAT17(qVar2.value,
                                     CONCAT16(qVar3.value,
                                              CONCAT15(in_stack_ffffffffffffffd5.value,
                                                       CONCAT14(in_stack_ffffffffffffffd4.value,
                                                                iVar4)))),
                            (quad_value *)CONCAT17(v,CONCAT16(uVar6,in_stack_ffffffffffffffc8)));
          if (bVar1) {
            return false;
          }
        }
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool
  signed_gt(const quad_value_bit_vector& a,
	    const quad_value_bit_vector& b) {

    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }
    
    assert(a.bitLength() == b.bitLength());

    int N = a.bitLength();

    // a negative b non-negative
    if ((a.get(N - 1) == 1) && (b.get(N - 1) == 0)) {
      return false;
    }

    // b negative a non-negative
    if ((b.get(N - 1) == 1) && (a.get(N - 1) == 0)) {
      return true;
    }

    // Both negative or both non-negative
    //if ((a.get(N - 1) == 1) && (b.get(N - 1) == 1)) {

    for (int i = N - 2; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;

  }